

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  xmlOutputBufferPtr out;
  _xmlDoc *p_Var2;
  long lVar3;
  xmlNode *node;
  _xmlNode *p_Var4;
  bool bVar5;
  xmlDocPtr pxVar6;
  _xmlDtd *p_Var7;
  char cVar8;
  int iVar9;
  _xmlNode **pp_Var10;
  _xmlDtd *p_Var11;
  _xmlDtd *p_Var12;
  byte bVar13;
  xmlDocPtr pxVar14;
  char *pcVar15;
  xmlChar *pxVar16;
  _xmlDtd *p_Var17;
  _xmlNode **pp_Var18;
  xmlDocPtr pxVar19;
  xmlDocPtr cur_00;
  bool bVar20;
  _xmlDtd *local_78;
  _xmlDtd *local_68;
  _xmlDtd *local_60;
  xmlDocPtr local_58;
  _xmlDtd *local_48;
  xmlChar *httpequiv;
  xmlDocPtr local_38;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  iVar1 = ctxt->format;
  buf = ctxt->buf;
  *(byte *)&ctxt->options = (byte)ctxt->options | 0x10;
  local_58 = (xmlDocPtr)0x0;
  pxVar6 = (xmlDocPtr)cur;
  cur_00 = (xmlDocPtr)cur->parent;
LAB_00167899:
  pxVar14 = cur_00;
  cur_00 = pxVar6;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if ((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (((xmlDocPtr)cur_00->parent != pxVar14) && (cur_00->children != (_xmlNode *)0x0)) {
      xhtmlNodeDumpOutput(ctxt,(xmlNodePtr)cur_00);
      break;
    }
    xmlOutputBufferWrite(buf,1,"<");
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
      xmlOutputBufferWriteString(buf,pcVar15);
      xmlOutputBufferWrite(buf,1,":");
    }
    xmlOutputBufferWriteString(buf,cur_00->name);
    if (cur_00->oldNs != (xmlNsPtr)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,cur_00->oldNs);
    }
    iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"html");
    if (((iVar9 != 0) &&
        (lVar3._0_4_ = cur_00->compression, lVar3._4_4_ = cur_00->standalone, lVar3 == 0)) &&
       (cur_00->oldNs == (_xmlNs *)0x0)) {
      xmlOutputBufferWriteString(buf," xmlns=\"http://www.w3.org/1999/xhtml\"");
    }
    p_Var17 = cur_00->extSubset;
    if (p_Var17 != (_xmlDtd *)0x0) {
      out = ctxt->buf;
      p_Var2 = p_Var17->parent;
      local_60 = (_xmlDtd *)0x0;
      local_68 = (_xmlDtd *)0x0;
      local_48 = (_xmlDtd *)0x0;
      local_78 = (_xmlDtd *)0x0;
      for (; p_Var17 != (_xmlDtd *)0x0; p_Var17 = (_xmlDtd *)p_Var17->next) {
        p_Var11 = local_60;
        if ((((p_Var17->notations != (void *)0x0) ||
             ((iVar9 = xmlStrEqual(p_Var17->name,"id"), p_Var12 = local_68, p_Var7 = p_Var17,
              iVar9 == 0 &&
              ((p_Var17->notations != (void *)0x0 ||
               ((iVar9 = xmlStrEqual(p_Var17->name,"name"), p_Var12 = p_Var17, p_Var7 = local_48,
                iVar9 == 0 &&
                ((p_Var17->notations != (void *)0x0 ||
                 ((iVar9 = xmlStrEqual(p_Var17->name,"lang"), p_Var12 = local_68, p_Var11 = p_Var17,
                  iVar9 == 0 && (p_Var11 = local_60, p_Var17->notations != (void *)0x0))))))))))))
            && (iVar9 = xmlStrEqual(p_Var17->name,"lang"), p_Var12 = local_68, p_Var11 = local_60,
               p_Var7 = local_48, iVar9 != 0)) &&
           (iVar9 = xmlStrEqual(*(xmlChar **)((long)p_Var17->notations + 0x18),(xmlChar *)"xml"),
           iVar9 != 0)) {
          local_78 = p_Var17;
        }
        local_48 = p_Var7;
        local_60 = p_Var11;
        local_68 = p_Var12;
        xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var17);
      }
      if ((((p_Var2 != (_xmlDoc *)0x0 && local_68 != (_xmlDtd *)0x0) && local_48 == (_xmlDtd *)0x0)
          && ((xmlChar *)p_Var2->name != (xmlChar *)0x0)) &&
         (((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"a"), iVar9 != 0 ||
           ((((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"p"), iVar9 != 0 ||
              (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"div"), iVar9 != 0)) ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"img"), iVar9 != 0)) ||
            ((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"map"), iVar9 != 0 ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"applet"), iVar9 != 0)))))) ||
          ((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"form"), iVar9 != 0 ||
           ((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"frame"), iVar9 != 0 ||
            (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"iframe"), iVar9 != 0)))))))) {
        xmlOutputBufferWrite(out,5," id=\"");
        xmlSaveWriteAttrContent(ctxt,(xmlAttrPtr)local_68);
        xmlOutputBufferWrite(out,1,"\"");
      }
      if ((local_60 == (_xmlDtd *)0x0) || (local_78 != (_xmlDtd *)0x0)) {
        if ((local_78 == (_xmlDtd *)0x0) || (local_60 != (_xmlDtd *)0x0)) goto LAB_00167f06;
        xmlOutputBufferWrite(out,7," lang=\"");
        local_60 = local_78;
      }
      else {
        xmlOutputBufferWrite(out,0xb," xml:lang=\"");
      }
      xmlSaveWriteAttrContent(ctxt,(xmlAttrPtr)local_60);
      xmlOutputBufferWrite(out,1,"\"");
    }
LAB_00167f06:
    if ((pxVar14 == (xmlDocPtr)0x0) || ((_xmlDoc *)pxVar14->parent != cur_00->doc)) {
LAB_00167f1b:
      bVar13 = 1;
      bVar5 = false;
    }
    else {
      iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"head");
      if ((iVar9 == 0) || (iVar9 = xmlStrEqual((xmlChar *)pxVar14->name,"html"), iVar9 == 0)) {
        bVar5 = false;
        bVar13 = 1;
      }
      else {
        pp_Var18 = &cur_00->children;
        while (node = *pp_Var18, node != (xmlNode *)0x0) {
          iVar9 = xmlStrEqual(node->name,(xmlChar *)"meta");
          if (iVar9 != 0) {
            iVar9 = xmlNodeGetAttrValue(node,(xmlChar *)"http-equiv",(xmlChar *)0x0,&httpequiv);
            if (iVar9 < 0) {
              xmlSaveErrMemory(buf);
            }
            else if (iVar9 == 0) {
              iVar9 = xmlStrcasecmp(httpequiv,(xmlChar *)"Content-Type");
              (*xmlFree)(httpequiv);
              if (iVar9 == 0) goto LAB_00167f1b;
            }
          }
          pp_Var18 = &node->next;
        }
        bVar5 = true;
        bVar13 = 0;
      }
    }
    pp_Var18 = &cur_00->children;
    if (cur_00->children == (_xmlNode *)0x0) {
      lVar3 = *(long *)&cur_00->compression;
      if (lVar3 == 0) {
        if (cur_00->type == XML_ELEMENT_NODE) goto LAB_001680c3;
      }
      else {
        if ((((*(long *)(lVar3 + 0x18) != 0) || (cur_00->type != XML_ELEMENT_NODE)) ||
            (iVar9 = xmlStrEqual(*(xmlChar **)(lVar3 + 0x10),
                                 (xmlChar *)"http://www.w3.org/1999/xhtml"), iVar9 == 0)) ||
           (*pp_Var18 != (_xmlNode *)0x0)) goto switchD_001680ed_caseD_64;
LAB_001680c3:
        pxVar16 = (xmlChar *)cur_00->name;
        if (pxVar16 == (xmlChar *)0x0) goto switchD_001680ed_caseD_64;
        switch(*pxVar16) {
        case 'a':
          pcVar15 = "area";
          break;
        case 'b':
          iVar9 = xmlStrEqual(pxVar16,"br");
          bVar20 = true;
          if (iVar9 != 0) {
LAB_001681f7:
            bVar20 = true;
            goto LAB_00168239;
          }
          iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"base");
          if (iVar9 != 0) goto LAB_00168239;
          pxVar16 = (xmlChar *)cur_00->name;
          pcVar15 = "basefont";
LAB_0016846a:
          iVar9 = xmlStrEqual(pxVar16,(xmlChar *)pcVar15);
          goto LAB_00168233;
        case 'c':
          pcVar15 = "col";
          break;
        default:
          goto switchD_001680ed_caseD_64;
        case 'f':
          pcVar15 = "frame";
          break;
        case 'h':
          pcVar15 = "hr";
          break;
        case 'i':
          iVar9 = xmlStrEqual(pxVar16,(xmlChar *)"img");
          bVar20 = true;
          if (iVar9 != 0) goto LAB_001681f7;
          iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"input");
          if (iVar9 == 0) {
            pxVar16 = (xmlChar *)cur_00->name;
            pcVar15 = "isindex";
            goto LAB_0016846a;
          }
          goto LAB_00168239;
        case 'l':
          pcVar15 = "link";
          break;
        case 'm':
          pcVar15 = "meta";
          break;
        case 'p':
          pcVar15 = "param";
        }
        iVar9 = xmlStrEqual(pxVar16,(xmlChar *)pcVar15);
LAB_00168233:
        bVar20 = iVar9 != 0;
LAB_00168239:
        if ((bool)(bVar13 & bVar20)) {
          xmlOutputBufferWrite(buf,3," />");
          break;
        }
      }
switchD_001680ed_caseD_64:
      xmlOutputBufferWrite(buf,1,">");
      if (bVar5) {
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(buf,1,"\n");
          xmlSaveWriteIndent(ctxt,1);
        }
        xmlOutputBufferWriteString
                  (buf,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
        if (ctxt->encoding == (xmlChar *)0x0) {
          xmlOutputBufferWrite(buf,5,"UTF-8");
        }
        else {
          xmlOutputBufferWriteString(buf,(char *)ctxt->encoding);
        }
        xmlOutputBufferWrite(buf,4,"\" />");
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(buf,1,"\n");
        }
      }
      xmlOutputBufferWrite(buf,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
        xmlOutputBufferWriteString(buf,pcVar15);
        xmlOutputBufferWrite(buf,1,":");
      }
      xmlOutputBufferWriteString(buf,cur_00->name);
      xmlOutputBufferWrite(buf,1,">");
      break;
    }
    xmlOutputBufferWrite(buf,1,">");
    if (bVar5) {
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(buf,1,"\n");
        xmlSaveWriteIndent(ctxt,1);
      }
      xmlOutputBufferWriteString
                (buf,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
      if (ctxt->encoding == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"UTF-8");
      }
      else {
        xmlOutputBufferWriteString(buf,(char *)ctxt->encoding);
      }
      xmlOutputBufferWrite(buf,4,"\" />");
    }
    pp_Var10 = pp_Var18;
    if (ctxt->format == 1) {
      while (p_Var4 = *pp_Var10, p_Var4 != (_xmlNode *)0x0) {
        if ((p_Var4->type == XML_ENTITY_REF_NODE) || (p_Var4->type == XML_TEXT_NODE)) {
          ctxt->format = 0;
          local_58 = cur_00;
          goto LAB_0016815f;
        }
        pp_Var10 = &p_Var4->next;
      }
      xmlOutputBufferWrite(buf,1,"\n");
    }
LAB_0016815f:
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar6 = (xmlDocPtr)*pp_Var18;
    goto LAB_00167899;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var17 = cur_00->intSubset;
    if (p_Var17 != (_xmlDtd *)0x0) {
      if ((xmlChar *)cur_00->name == "textnoenc") {
        xmlOutputBufferWriteString(buf,(char *)p_Var17);
      }
      else if (ctxt->escape == (xmlCharEncodingOutputFunc)0x0) {
        xmlSaveWriteText(ctxt,(xmlChar *)p_Var17,0);
      }
      else {
        xmlOutputBufferWriteEscape(buf,(xmlChar *)p_Var17,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    p_Var17 = cur_00->intSubset;
    if ((p_Var17 != (_xmlDtd *)0x0) &&
       (cVar8 = *(char *)&p_Var17->_private, p_Var11 = p_Var17, local_38 = (xmlDocPtr)cur,
       cVar8 != '\0')) {
      do {
        p_Var12 = p_Var11;
        if (cVar8 == ']') {
          if ((*(char *)((long)&p_Var17->_private + 1) == ']') &&
             (*(char *)((long)&p_Var17->_private + 2) == '>')) {
            p_Var12 = (_xmlDtd *)((long)&p_Var17->_private + 2);
            xmlOutputBufferWrite(buf,9,"<![CDATA[");
            cur = (xmlNodePtr)local_38;
            xmlOutputBufferWrite(buf,(int)p_Var12 - (int)p_Var11,(char *)p_Var11);
            xmlOutputBufferWrite(buf,3,"]]>");
            p_Var17 = p_Var12;
          }
        }
        else if (cVar8 == '\0') goto LAB_00167ce1;
        cVar8 = *(char *)((long)&p_Var17->_private + 1);
        p_Var17 = (_xmlDtd *)((long)&p_Var17->_private + 1);
        p_Var11 = p_Var12;
      } while( true );
    }
    xmlOutputBufferWrite(buf,0xc,"<![CDATA[]]>");
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(buf,1,"&");
    xmlOutputBufferWriteString(buf,cur_00->name);
    xmlOutputBufferWrite(buf,1,";");
    break;
  case XML_PI_NODE:
    p_Var17 = cur_00->intSubset;
    xmlOutputBufferWrite(buf,2,"<?");
    xmlOutputBufferWriteString(buf,cur_00->name);
    if ((p_Var17 != (_xmlDtd *)0x0) && (cur_00->intSubset != (_xmlDtd *)0x0)) {
      xmlOutputBufferWrite(buf,1," ");
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
    }
    xmlOutputBufferWrite(buf,2,"?>");
    break;
  case XML_COMMENT_NODE:
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(buf,4,"<!--");
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
      xmlOutputBufferWrite(buf,3,"-->");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlSaveDocInternal(ctxt,cur_00,ctxt->encoding);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    goto switchD_001678b4_caseD_b;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(buf,(xmlElementPtr)cur_00);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(buf,(xmlAttributePtr)cur_00);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(buf,(xmlEntityPtr)cur_00);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_001678b4_caseD_6:
  do {
    pxVar19 = cur_00;
    do {
      do {
        cur_00 = pxVar14;
        if (pxVar19 == (xmlDocPtr)cur) {
          return;
        }
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(buf,1,"\n");
        }
        pxVar6 = (xmlDocPtr)pxVar19->next;
        if ((xmlDocPtr)pxVar19->next != (xmlDocPtr)0x0) goto LAB_00167899;
        pxVar14 = (xmlDocPtr)cur_00->parent;
        pxVar19 = cur_00;
      } while (cur_00->type != XML_ELEMENT_NODE);
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      if (ctxt->format == 1) {
        xmlSaveWriteIndent(ctxt,0);
      }
      xmlOutputBufferWrite(buf,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
        xmlOutputBufferWriteString(buf,pcVar15);
        xmlOutputBufferWrite(buf,1,":");
      }
      xmlOutputBufferWriteString(buf,cur_00->name);
      xmlOutputBufferWrite(buf,1,">");
    } while (cur_00 != local_58);
    ctxt->format = iVar1;
    local_58 = (xmlDocPtr)0x0;
  } while( true );
switchD_001678b4_caseD_b:
  if (((xmlDocPtr)cur_00->parent == pxVar14) &&
     (pxVar6 = (xmlDocPtr)cur_00->children, (xmlDocPtr)cur_00->children != (xmlDocPtr)0x0))
  goto LAB_00167899;
  goto switchD_001678b4_caseD_6;
LAB_00167ce1:
  if (p_Var11 != p_Var17) {
    xmlOutputBufferWrite(buf,9,"<![CDATA[");
    xmlOutputBufferWriteString(buf,(char *)p_Var11);
    xmlOutputBufferWrite(buf,3,"]]>");
  }
  goto switchD_001678b4_caseD_6;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta, oldoptions;
    xmlNodePtr tmp, root, unformattedNode = NULL, parent;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    oldoptions = ctxt->options;
    ctxt->options |= XML_SAVE_XHTML;

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlSaveDocInternal(ctxt, (xmlDocPtr) cur, ctxt->encoding);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutput(buf, (xmlNsPtr) cur, ctxt);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            /* Always validate cur->parent when descending. */
            if ((cur->parent == parent) && (cur->children != NULL)) {
                parent = cur;
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                xhtmlNodeDumpOutput(ctxt, cur);
                break;
            }

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((parent != NULL) &&
                (parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        int res;
                        xmlChar *httpequiv;

                        res = xmlNodeGetAttrValue(tmp, BAD_CAST "http-equiv",
                                                  NULL, &httpequiv);
                        if (res < 0) {
                            xmlSaveErrMemory(buf);
                        } else if (res == 0) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            xmlSaveWriteIndent(ctxt, 1);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        xmlSaveWriteIndent(ctxt, 1);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                parent = cur;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                if (ctxt->escape)
                    xmlOutputBufferWriteEscape(buf, cur->content,
                                               ctxt->escape);
                else
                    xmlSaveWriteText(ctxt, cur->content, /* flags */ 0);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if (ctxt->format == 1)
                    xmlSaveWriteIndent(ctxt, 0);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }

    ctxt->options = oldoptions;
}